

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpbyepacket.h
# Opt level: O0

size_t __thiscall jrtplib::RTCPBYEPacket::GetReasonLength(RTCPBYEPacket *this)

{
  uint8_t *reasonlen;
  RTCPBYEPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPBYEPacket *)0x0;
  }
  else if (this->reasonoffset == 0) {
    this_local = (RTCPBYEPacket *)0x0;
  }
  else {
    this_local = (RTCPBYEPacket *)(ulong)(this->super_RTCPPacket).data[this->reasonoffset];
  }
  return (size_t)this_local;
}

Assistant:

inline size_t RTCPBYEPacket::GetReasonLength() const
{
	if (!knownformat)
		return 0;
	if (reasonoffset == 0)
		return 0;
	uint8_t *reasonlen = (data+reasonoffset);
	return (size_t)(*reasonlen);
}